

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void addition_suite::add_integer_with_real(void)

{
  undefined4 local_184;
  type_conflict4 local_180;
  undefined1 local_17b;
  undefined1 local_17a [2];
  longdouble local_178;
  basic_variable<std::allocator<char>_> local_168;
  undefined1 local_138 [8];
  basic_variable<std::allocator<char>_> data_2;
  undefined4 local_fc;
  type_conflict4 local_f8;
  undefined1 local_f3;
  undefined1 local_f2 [2];
  double local_f0;
  basic_variable<std::allocator<char>_> local_e8;
  undefined1 local_b8 [8];
  basic_variable<std::allocator<char>_> data_1;
  undefined1 local_7f;
  undefined1 local_7e [18];
  float local_6c;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  basic_variable<std::allocator<char>_> data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_68,2);
  local_6c = 3.0;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_38,&local_68,&local_6c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_7f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x98b,"void addition_suite::add_integer_with_real()",local_7e,&local_7f);
  data_1.storage._44_4_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                 ((basic_variable<std::allocator<char>_> *)local_38);
  data_1.storage._40_4_ = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x98c,"void addition_suite::add_integer_with_real()",&data_1.storage.field_0x2c,
             &data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_e8,2);
  local_f0 = 3.0;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_b8,&local_e8,&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  local_f2[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                          ((basic_variable<std::allocator<char>_> *)local_b8);
  local_f3 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x990,"void addition_suite::add_integer_with_real()",local_f2,&local_f3);
  local_f8 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                       ((basic_variable<std::allocator<char>_> *)local_b8);
  local_fc = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x991,"void addition_suite::add_integer_with_real()",&local_f8,&local_fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  local_178 = (longdouble)3.0;
  trial::dynamic::operator+
            ((basic_variable<std::allocator<char>_> *)local_138,&local_168,&local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_168);
  local_17a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                           ((basic_variable<std::allocator<char>_> *)local_138);
  local_17b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x995,"void addition_suite::add_integer_with_real()",local_17a,&local_17b);
  local_180 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                        ((basic_variable<std::allocator<char>_> *)local_138);
  local_184 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x996,"void addition_suite::add_integer_with_real()",&local_180,&local_184);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138);
  return;
}

Assistant:

void add_integer_with_real()
{
    {
        auto data = variable(2) + 3.0f;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), 5);
    }
    {
        auto data = variable(2) + 3.0;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), 5);
    }
    {
        auto data = variable(2) + 3.0L;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(), 5);
    }
}